

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WindowRewrite(Parse *pParse,Select *p)

{
  sqlite3 *db;
  Expr *pWhere;
  ExprList *pGroupBy;
  Expr *pHaving;
  Window *pWVar1;
  Window *pWVar2;
  int iVar3;
  int iVar4;
  Vdbe *p_00;
  ExprList *pEVar5;
  ExprList *pEVar6;
  Expr *pEVar7;
  Select *p_01;
  SrcList *pSVar8;
  int local_c0;
  Walker sWalker;
  Window *local_58;
  SrcList *pSStack_50;
  ExprList *local_48;
  undefined8 uStack_40;
  
  iVar3 = 0;
  if ((p->pWin != (Window *)0x0) && (p->pPrior == (Select *)0x0)) {
    p_00 = sqlite3GetVdbe(pParse);
    db = pParse->db;
    pSVar8 = p->pSrc;
    pWhere = p->pWhere;
    pGroupBy = p->pGroupBy;
    pHaving = p->pHaving;
    pWVar1 = p->pWin;
    p->pGroupBy = (ExprList *)0x0;
    p->pHaving = (Expr *)0x0;
    p->pSrc = (SrcList *)0x0;
    p->pWhere = (Expr *)0x0;
    pEVar5 = sqlite3ExprListDup(db,pWVar1->pPartition,0);
    pEVar5 = exprListAppendList(pParse,pEVar5,pWVar1->pOrderBy);
    if ((pEVar5 != (ExprList *)0x0) &&
       ((p->pOrderBy != (ExprList *)0x0 &&
        (iVar3 = sqlite3ExprListCompare(pEVar5,p->pOrderBy,-1), iVar3 == 0)))) {
      if (p->pOrderBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pOrderBy);
      }
      p->pOrderBy = (ExprList *)0x0;
    }
    iVar3 = pParse->nTab;
    pParse->nTab = iVar3 + 1;
    pWVar1->iEphCsr = iVar3;
    pParse->nTab = iVar3 + 4;
    sWalker.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    sWalker.walkerDepth = 0;
    sWalker.eCode = '\0';
    sWalker._37_3_ = 0;
    local_48 = (ExprList *)0x0;
    uStack_40 = 0;
    sWalker.xExprCallback = selectWindowRewriteExprCb;
    sWalker.xSelectCallback = selectWindowRewriteSelectCb;
    sWalker.pParse = pParse;
    sWalker.u.pNC = (NameContext *)&local_58;
    local_58 = pWVar1;
    pSStack_50 = pSVar8;
    sqlite3WalkExprList(&sWalker,p->pEList);
    sWalker.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    sWalker.walkerDepth = 0;
    sWalker.eCode = '\0';
    sWalker._37_3_ = 0;
    uStack_40 = 0;
    sWalker.xExprCallback = selectWindowRewriteExprCb;
    sWalker.xSelectCallback = selectWindowRewriteSelectCb;
    sWalker.pParse = pParse;
    sWalker.u.pNC = (NameContext *)&local_58;
    local_58 = pWVar1;
    pSStack_50 = pSVar8;
    sqlite3WalkExprList(&sWalker,p->pOrderBy);
    iVar3 = 0;
    if (local_48 != (ExprList *)0x0) {
      iVar3 = local_48->nExpr;
    }
    pWVar1->nBufferCol = iVar3;
    pEVar6 = exprListAppendList(pParse,local_48,pWVar1->pPartition);
    pEVar6 = exprListAppendList(pParse,pEVar6,pWVar1->pOrderBy);
    for (pWVar2 = pWVar1; pWVar2 != (Window *)0x0; pWVar2 = pWVar2->pNextWin) {
      iVar3 = 0;
      if (pEVar6 != (ExprList *)0x0) {
        iVar3 = pEVar6->nExpr;
      }
      pWVar2->iArgCol = iVar3;
      pEVar6 = exprListAppendList(pParse,pEVar6,(pWVar2->pOwner->x).pList);
      if (pWVar2->pFilter != (Expr *)0x0) {
        pEVar7 = exprDup(db,pWVar2->pFilter,0,(u8 **)0x0);
        pEVar6 = sqlite3ExprListAppend(pParse,pEVar6,pEVar7);
      }
      iVar4 = pParse->nMem;
      iVar3 = iVar4 + 1;
      pParse->nMem = iVar3;
      pWVar2->regAccum = iVar3;
      iVar4 = iVar4 + 2;
      pParse->nMem = iVar4;
      pWVar2->regResult = iVar4;
      sqlite3VdbeAddOp3(p_00,0x49,0,iVar3,0);
    }
    if (pEVar6 == (ExprList *)0x0) {
      pEVar7 = sqlite3ExprAlloc(db,0x93,sqlite3IntTokens,0);
      pEVar6 = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar7);
    }
    p_01 = sqlite3SelectNew(pParse,pEVar6,pSVar8,pWhere,pGroupBy,pHaving,pEVar5,0,(Expr *)0x0);
    pSVar8 = sqlite3SrcListAppend(pParse,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
    p->pSrc = pSVar8;
    if (pSVar8 == (SrcList *)0x0) {
      if (p_01 != (Select *)0x0) {
        clearSelect(db,p_01,1);
      }
      local_c0 = 0;
    }
    else {
      pSVar8->a[0].pSelect = p_01;
      sqlite3SrcListAssignCursors(pParse,pSVar8);
      iVar3 = sqlite3ExpandSubquery(pParse,p->pSrc->a);
      local_c0 = 7;
      if (iVar3 == 0) {
        *(byte *)&p_01->selFlags = (byte)p_01->selFlags | 0x40;
        *(byte *)&p->selFlags = (byte)p->selFlags & 0xf7;
        local_c0 = 0;
        sqlite3SelectPrep(pParse,p_01,(NameContext *)0x0);
      }
      sqlite3VdbeAddOp3(p_00,0x71,pWVar1->iEphCsr,pEVar6->nExpr,0);
      sqlite3VdbeAddOp3(p_00,0x6f,pWVar1->iEphCsr + 1,pWVar1->iEphCsr,0);
      sqlite3VdbeAddOp3(p_00,0x6f,pWVar1->iEphCsr + 2,pWVar1->iEphCsr,0);
      sqlite3VdbeAddOp3(p_00,0x6f,pWVar1->iEphCsr + 3,pWVar1->iEphCsr,0);
    }
    iVar3 = 7;
    if (db->mallocFailed == '\0') {
      iVar3 = local_c0;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3WindowRewrite(Parse *pParse, Select *p){
  int rc = SQLITE_OK;
  if( p->pWin && p->pPrior==0 ){
    Vdbe *v = sqlite3GetVdbe(pParse);
    sqlite3 *db = pParse->db;
    Select *pSub = 0;             /* The subquery */
    SrcList *pSrc = p->pSrc;
    Expr *pWhere = p->pWhere;
    ExprList *pGroupBy = p->pGroupBy;
    Expr *pHaving = p->pHaving;
    ExprList *pSort = 0;

    ExprList *pSublist = 0;       /* Expression list for sub-query */
    Window *pMWin = p->pWin;      /* Master window object */
    Window *pWin;                 /* Window object iterator */

    p->pSrc = 0;
    p->pWhere = 0;
    p->pGroupBy = 0;
    p->pHaving = 0;

    /* Create the ORDER BY clause for the sub-select. This is the concatenation
    ** of the window PARTITION and ORDER BY clauses. Then, if this makes it
    ** redundant, remove the ORDER BY from the parent SELECT.  */
    pSort = sqlite3ExprListDup(db, pMWin->pPartition, 0);
    pSort = exprListAppendList(pParse, pSort, pMWin->pOrderBy);
    if( pSort && p->pOrderBy ){
      if( sqlite3ExprListCompare(pSort, p->pOrderBy, -1)==0 ){
        sqlite3ExprListDelete(db, p->pOrderBy);
        p->pOrderBy = 0;
      }
    }

    /* Assign a cursor number for the ephemeral table used to buffer rows.
    ** The OpenEphemeral instruction is coded later, after it is known how
    ** many columns the table will have.  */
    pMWin->iEphCsr = pParse->nTab++;
    pParse->nTab += 3;

    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pEList, &pSublist);
    selectWindowRewriteEList(pParse, pMWin, pSrc, p->pOrderBy, &pSublist);
    pMWin->nBufferCol = (pSublist ? pSublist->nExpr : 0);

    /* Append the PARTITION BY and ORDER BY expressions to the to the 
    ** sub-select expression list. They are required to figure out where 
    ** boundaries for partitions and sets of peer rows lie.  */
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pPartition);
    pSublist = exprListAppendList(pParse, pSublist, pMWin->pOrderBy);

    /* Append the arguments passed to each window function to the
    ** sub-select expression list. Also allocate two registers for each
    ** window function - one for the accumulator, another for interim
    ** results.  */
    for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
      pWin->iArgCol = (pSublist ? pSublist->nExpr : 0);
      pSublist = exprListAppendList(pParse, pSublist, pWin->pOwner->x.pList);
      if( pWin->pFilter ){
        Expr *pFilter = sqlite3ExprDup(db, pWin->pFilter, 0);
        pSublist = sqlite3ExprListAppend(pParse, pSublist, pFilter);
      }
      pWin->regAccum = ++pParse->nMem;
      pWin->regResult = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
    }

    /* If there is no ORDER BY or PARTITION BY clause, and the window
    ** function accepts zero arguments, and there are no other columns
    ** selected (e.g. "SELECT row_number() OVER () FROM t1"), it is possible
    ** that pSublist is still NULL here. Add a constant expression here to 
    ** keep everything legal in this case. 
    */
    if( pSublist==0 ){
      pSublist = sqlite3ExprListAppend(pParse, 0, 
          sqlite3ExprAlloc(db, TK_INTEGER, &sqlite3IntTokens[0], 0)
      );
    }

    pSub = sqlite3SelectNew(
        pParse, pSublist, pSrc, pWhere, pGroupBy, pHaving, pSort, 0, 0
    );
    p->pSrc = sqlite3SrcListAppend(pParse, 0, 0, 0);
    if( p->pSrc ){
      p->pSrc->a[0].pSelect = pSub;
      sqlite3SrcListAssignCursors(pParse, p->pSrc);
      if( sqlite3ExpandSubquery(pParse, &p->pSrc->a[0]) ){
        rc = SQLITE_NOMEM;
      }else{
        pSub->selFlags |= SF_Expanded;
        p->selFlags &= ~SF_Aggregate;
        sqlite3SelectPrep(pParse, pSub, 0);
      }

      sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pMWin->iEphCsr, pSublist->nExpr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+1, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+2, pMWin->iEphCsr);
      sqlite3VdbeAddOp2(v, OP_OpenDup, pMWin->iEphCsr+3, pMWin->iEphCsr);
    }else{
      sqlite3SelectDelete(db, pSub);
    }
    if( db->mallocFailed ) rc = SQLITE_NOMEM;
  }

  return rc;
}